

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::buyCards(Player *this)

{
  DynastyDeck *this_00;
  Stronghold *this_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  ostream *poVar6;
  BlackCard *this_02;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar7;
  BlackCard *card;
  string *psVar8;
  char *pcVar9;
  char ans;
  string buy;
  char local_a9;
  Player *local_a8;
  DynastyDeck *local_a0;
  DynastyDeck *local_98;
  DynastyDeck *local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  _List_base<Card_*,_std::allocator<Card_*>_> local_68;
  string local_50;
  
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  local_a8 = this;
  poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to buy a card?");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator>>((istream *)&std::cin,&local_a9);
  this_00 = &local_a8->provinces;
  local_90 = &local_a8->army;
  local_a0 = &local_a8->holdings;
  local_98 = &local_a8->dynDeck;
  do {
    if (local_a9 != 'y') {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::~string((string *)&local_88);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Enter name of province to buy");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator>>((istream *)&std::cin,(string *)&local_88);
    std::__cxx11::string::string((string *)&local_50,(string *)&local_88);
    this_02 = DynastyDeck::searchDeck(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (this_02 == (BlackCard *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Invalid province");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      bVar1 = BlackCard::isRevealed(this_02);
      pcVar9 = "Invalid province";
      if (bVar1) {
        iVar2 = Stronghold::getMoney(local_a8->stronghold);
        iVar3 = (*(this_02->super_Card)._vptr_Card[4])(this_02);
        pcVar9 = "Not enough money";
        if (iVar2 < iVar3) goto LAB_0010851d;
        iVar2 = local_a8->honour;
        iVar3 = (*(this_02->super_Card)._vptr_Card[6])(this_02);
        pcVar9 = "Not enough honour";
        if (iVar2 < iVar3) goto LAB_0010851d;
        this_01 = local_a8->stronghold;
        uVar4 = Stronghold::getMoney(this_01);
        iVar2 = (**(this_02->super_Card)._vptr_Card)
                          (this_02,(ulong)uVar4,(ulong)(uint)local_a8->honour);
        Stronghold::setMoney(this_01,iVar2);
        TVar5 = Card::getType(&this_02->super_Card);
        if (TVar5 == HOLDING) {
          DynastyDeck::pushCard(local_a0,this_02);
          Deck::getDeck_abi_cxx11_
                    ((list<Card_*,_std::allocator<Card_*>_> *)&local_68,&local_a0->super_Deck);
          (*(this_02->super_Card)._vptr_Card[5])(this_02,&local_68,this_02);
          std::__cxx11::_List_base<Card_*,_std::allocator<Card_*>_>::_M_clear(&local_68);
        }
        else {
          DynastyDeck::pushCard(local_90,this_02);
        }
        plVar7 = DynastyDeck::getDynDeck_abi_cxx11_(local_98);
        card = DynastyDeck::popCard
                         (local_98,(BlackCard *)
                                   (plVar7->
                                   super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>).
                                   _M_impl._M_node.super__List_node_base._M_next[1]._M_next);
        DynastyDeck::pushCard(this_00,card);
        poVar6 = std::operator<<((ostream *)&std::cout,"Bought card ");
        psVar8 = BlackCard::getName_abi_cxx11_(this_02);
        poVar6 = std::operator<<(poVar6,(string *)psVar8);
      }
      else {
LAB_0010851d:
        poVar6 = std::operator<<((ostream *)&std::cout,pcVar9);
      }
      std::endl<char,std::char_traits<char>>(poVar6);
      (*(this_02->super_Card)._vptr_Card[3])(this_02);
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"Do you want to buy more cards?");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<(poVar6,"Enter y for yes, n for no");
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x118160);
    std::operator>>((istream *)&std::cin,&local_a9);
  } while( true );
}

Assistant:

void Player::buyCards()                                     //player can buy holdings or personalities from his provinces if he wants to
{
    string buy;
    char ans;

    cout << "Do you want to buy a card?"<<endl<<"Enter y for yes, n for no"<<endl;
    cin >> ans;

    //buys selected province if enough money and honour and replaces it with an unrevealed card from dynDeck
    while (ans == 'y')
    {
        cout << "Enter name of province to buy" << endl;
        cin >> buy;

        BlackCard *bought = provinces.searchDeck(buy);           //searches from province with name = buy
        if (bought)
        {
            if (!bought->isRevealed())
                cout <<"Invalid province"<<endl;
            else if (stronghold->getMoney() < bought->getCost())
                cout << "Not enough money" << endl;
            else if (honour < bought->getHonour())
                cout << "Not enough honour" << endl;
            else
            {
                stronghold->setMoney(bought->effectBonus(stronghold->getMoney(), honour));      //pay

                //add it to player's holdings or army
                if (bought->getType() == Card::HOLDING)
                {
                    holdings.pushCard(bought);
                    bought->ChainHoldings(holdings.getDeck(), reinterpret_cast<Holding *>(bought));    //check for chains
                }
                else
                    army.pushCard(bought);

                //replace it with new unrevealed province from dynDeck
                provinces.pushCard(dynDeck.popCard(*dynDeck.getDynDeck().begin()));
                cout << "Bought card " << bought->getName() << endl;
            }
        }
        else
            cout << "Invalid province"<<endl;

        delete bought;

        cout << "Do you want to buy more cards?"<<endl<<"Enter y for yes, n for no"<<endl;
        cin.clear();
        cin >> ans;
    }
    cout<<endl;
}